

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void AddArgsToScope(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,bool assignLocation)

{
  code *pcVar1;
  anon_class_32_4_343c1aa9 handler;
  anon_class_32_4_343c1aa9 handler_00;
  ArgSlot AVar2;
  char cVar3;
  bool bVar4;
  Type *ppFVar5;
  undefined4 *puVar6;
  ParseNodePtr arg;
  ParseNodeParamPattern *pPVar7;
  ParseNode *pPVar8;
  undefined1 auStack_50 [8];
  anon_class_32_4_343c1aa9 addArgToScope;
  ByteCodeGenerator *byteCodeGenerator_local;
  bool isNonSimpleParameterList;
  ArgSlot pos;
  bool assignLocation_local;
  
  addArgToScope.assignLocation = (bool *)byteCodeGenerator;
  byteCodeGenerator_local._7_1_ = assignLocation;
  ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&byteCodeGenerator->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  if ((*ppFVar5)->varRegsCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x901,"(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0)",
                       "byteCodeGenerator->TopFuncInfo()->varRegsCount == 0");
    if (!bVar4) goto LAB_00834f59;
    *puVar6 = 0;
  }
  addArgToScope.byteCodeGenerator = (ByteCodeGenerator **)((long)&byteCodeGenerator_local + 4);
  byteCodeGenerator_local._4_2_ = 1;
  byteCodeGenerator_local._3_1_ = (byte)(pnodeFnc->fncFlags >> 0xf) & 1;
  addArgToScope.pos = (ArgSlot *)((long)&byteCodeGenerator_local + 3);
  auStack_50 = (undefined1  [8])&addArgToScope.assignLocation;
  addArgToScope.isNonSimpleParameterList = (bool *)((long)&byteCodeGenerator_local + 7);
  arg = pnodeFnc->pnodeParams;
  if (arg != (ParseNodePtr)0x0) {
    do {
      AddArgsToScope::anon_class_32_4_343c1aa9::operator()
                ((anon_class_32_4_343c1aa9 *)auStack_50,arg);
      arg = ParseNode::GetFormalNext(arg);
    } while (arg != (ParseNodePtr)0x0);
  }
  AVar2 = byteCodeGenerator_local._4_2_;
  ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (*(SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> **)
                        (addArgToScope.assignLocation + 0x18));
  cVar3 = byteCodeGenerator_local._7_1_;
  (*ppFVar5)->inArgsCount = AVar2;
  if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
    byteCodeGenerator_local._7_1_ = 1;
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()
              ((anon_class_32_4_343c1aa9 *)auStack_50,pnodeFnc->pnodeRest);
  }
  byteCodeGenerator_local._7_1_ = cVar3;
  for (pPVar8 = pnodeFnc->pnodeParams; pPVar8 != (ParseNode *)0x0;
      pPVar8 = ParseNode::GetFormalNext(pPVar8)) {
    if (pPVar8->nop == knopParamPattern) {
      pPVar7 = ParseNode::AsParseNodeParamPattern(pPVar8);
      handler.pos = (ArgSlot *)addArgToScope.byteCodeGenerator;
      handler.byteCodeGenerator = (ByteCodeGenerator **)auStack_50;
      handler.isNonSimpleParameterList = (bool *)addArgToScope.pos;
      handler.assignLocation = addArgToScope.isNonSimpleParameterList;
      Parser::MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                ((pPVar7->super_ParseNodeUni).pnode1,handler);
    }
  }
  pPVar8 = pnodeFnc->pnodeRest;
  if ((pPVar8 != (ParseNode *)0x0) && (pPVar8->nop == knopParamPattern)) {
    pPVar7 = ParseNode::AsParseNodeParamPattern(pPVar8);
    handler_00.pos = (ArgSlot *)addArgToScope.byteCodeGenerator;
    handler_00.byteCodeGenerator = (ByteCodeGenerator **)auStack_50;
    handler_00.isNonSimpleParameterList = (bool *)addArgToScope.pos;
    handler_00.assignLocation = addArgToScope.isNonSimpleParameterList;
    Parser::MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
              ((pPVar7->super_ParseNodeUni).pnode1,handler_00);
  }
  if ((byteCodeGenerator_local._7_1_ == '\x01') &&
     (ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (*(SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> **)
                            (addArgToScope.assignLocation + 0x18)),
     (*ppFVar5)->varRegsCount + 1 != (uint)byteCodeGenerator_local._4_2_)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x93b,
                       "(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos)"
                       ,
                       "!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos"
                      );
    if (!bVar4) {
LAB_00834f59:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void AddArgsToScope(ParseNodeFnc * pnodeFnc, ByteCodeGenerator *byteCodeGenerator, bool assignLocation)
{
    Assert(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0);
    Js::ArgSlot pos = 1;
    bool isNonSimpleParameterList = pnodeFnc->HasNonSimpleParameterList();

    auto addArgToScope = [&](ParseNode *arg)
    {
        if (arg->IsVarLetOrConst())
        {
            ParseNodeVar * pnodeVarArg = arg->AsParseNodeVar();
            Symbol *formal = byteCodeGenerator->AddSymbolToScope(byteCodeGenerator->TopFuncInfo()->GetParamScope(),
                reinterpret_cast<const char16*>(pnodeVarArg->pid->Psz()),
                pnodeVarArg->pid->Cch(),
                pnodeVarArg,
                STFormal);
#if DBG_DUMP
            if (byteCodeGenerator->Trace())
            {
                Output::Print(_u("current context has declared arg %s of type %s at position %d\n"), arg->AsParseNodeVar()->pid->Psz(), formal->GetSymbolTypeName(), pos);
            }
#endif

            if (isNonSimpleParameterList)
            {
                formal->SetIsNonSimpleParameter(true);
            }

            pnodeVarArg->sym = formal;
            MarkFormal(byteCodeGenerator, formal, assignLocation || isNonSimpleParameterList, isNonSimpleParameterList);
        }
        else if (arg->nop == knopParamPattern)
        {
            arg->AsParseNodeParamPattern()->location = byteCodeGenerator->NextVarRegister();
        }
        else
        {
            Assert(false);
        }
        ArgSlotMath::Inc(pos);
    };

    // We process rest separately because the number of in args needs to exclude rest.
    MapFormalsWithoutRest(pnodeFnc, addArgToScope);
    byteCodeGenerator->SetNumberOfInArgs(pos);

    if (pnodeFnc->pnodeRest != nullptr)
    {
        // The rest parameter will always be in a register, regardless of whether it is in a scope slot.
        // We save the assignLocation value for the assert condition below.
        bool assignLocationSave = assignLocation;
        assignLocation = true;

        addArgToScope(pnodeFnc->pnodeRest);

        assignLocation = assignLocationSave;
    }

    MapFormalsFromPattern(pnodeFnc, addArgToScope);

    Assert(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos);
}